

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O0

void __thiscall validation_tests::test_assumeutxo::test_method(test_assumeutxo *this)

{
  initializer_list<int> __l;
  bool bVar1;
  AssumeutxoData *pAVar2;
  long in_FS_OFFSET;
  int empty;
  vector<int,_std::allocator<int>_> *__range1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> bad_heights;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> params;
  AssumeutxoData out110_2;
  AssumeutxoData out110;
  optional<AssumeutxoData> out;
  char *in_stack_fffffffffffffaf8;
  char *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  lazy_ostream *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  size_t line_num;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  lazy_ostream *in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  ChainType in_stack_fffffffffffffb4c;
  ArgsManager *in_stack_fffffffffffffb50;
  uchar local_42c [20];
  undefined1 local_418 [32];
  undefined1 local_3c8 [68];
  uchar local_384 [20];
  undefined1 local_330 [16];
  undefined1 local_320 [64];
  const_string local_2e0 [2];
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  int *local_268;
  int *local_260;
  undefined1 local_230 [32];
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1fc [6];
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [120];
  undefined1 local_d0 [40];
  undefined1 local_a8 [128];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
  local_18 = 0xd3000000d1;
  local_28 = 0x6400000000;
  uStack_20 = 0x730000006f;
  std::allocator<int>::allocator((allocator<int> *)in_stack_fffffffffffffaf8);
  __l._M_len._0_4_ = in_stack_fffffffffffffb48;
  __l._M_array = (iterator)in_stack_fffffffffffffb40;
  __l._M_len._4_4_ = in_stack_fffffffffffffb4c;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb38,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
  std::allocator<int>::~allocator((allocator<int> *)in_stack_fffffffffffffaf8);
  local_260 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00);
  local_268 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00);
  while (bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffb08,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffb00), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffaf8);
    std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
              ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
               in_stack_fffffffffffffaf8);
    CChainParams::AssumeutxoForHeight
              ((CChainParams *)in_stack_fffffffffffffb00,
               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                 (unsigned_long)in_stack_fffffffffffffaf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffb38,
                 (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
      std::optional::operator_cast_to_bool((optional<AssumeutxoData> *)in_stack_fffffffffffffaf8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffb08,
                 SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                 (unsigned_long)in_stack_fffffffffffffaf8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffb00,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                 (unsigned_long)in_stack_fffffffffffffaf8);
      in_stack_fffffffffffffaf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2a0,local_2c0,local_2e0,0x8d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffaf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffaf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffaf8);
  }
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffaf8);
  CChainParams::AssumeutxoForHeight
            ((CChainParams *)in_stack_fffffffffffffb00,
             (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  pAVar2 = std::optional<AssumeutxoData>::operator*
                     ((optional<AssumeutxoData> *)in_stack_fffffffffffffaf8);
  memcpy(local_d0,pAVar2,0x50);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,
               (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    BaseHash<uint256>::ToString_abi_cxx11_((BaseHash<uint256> *)in_stack_fffffffffffffb00);
    in_stack_fffffffffffffb08 =
         "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"";
    in_stack_fffffffffffffb00 = "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1";
    in_stack_fffffffffffffaf8 = "out110.hash_serialized.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_320,local_330,0x91,1,2,local_148);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,
               (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    local_384[0] = 'o';
    local_384[1] = '\0';
    local_384[2] = '\0';
    local_384[3] = '\0';
    in_stack_fffffffffffffb08 = "111U";
    in_stack_fffffffffffffb00 = (char *)local_384;
    in_stack_fffffffffffffaf8 = "out110.m_chain_tx_count";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&stack0xfffffffffffffc90,local_384 + 4,0x92,1,2,local_a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffaf8);
  local_1fc[0]._M_local_buf[0xb] = 'i';
  local_1fc[0]._M_local_buf[10] = 'n';
  local_1fc[0]._M_local_buf[9] = -0x6e;
  local_1fc[0]._M_local_buf[8] = -0x7e;
  local_1fc[0]._M_local_buf[7] = '\x1f';
  local_1fc[0]._M_local_buf[6] = 'e';
  local_1fc[0]._M_local_buf[5] = 'T';
  local_1fc[0]._M_local_buf[4] = -100;
  local_1fc[0]._M_local_buf[3] = '~';
  local_1fc[0]._M_local_buf[2] = -0x1f;
  local_1fc[0]._M_local_buf[1] = '4';
  local_1fc[0]._M_local_buf[0] = -0x13;
  local_1fd = 0xce;
  local_1fe = 0xee;
  local_1ff = 0xea;
  local_200 = 0xaa;
  local_201 = 0x41;
  local_202 = 5;
  local_203 = 100;
  local_204 = 0x7a;
  local_205 = 0x3c;
  local_206 = 0x4f;
  local_207 = 0xd9;
  local_208 = 0xf2;
  local_209 = 0x98;
  local_20a = 0xc0;
  local_20b = 0xae;
  local_20c = 0xc0;
  local_20d = 0xab;
  local_20e = 0x50;
  local_20f = 0x42;
  local_210 = 0x5c;
  CChainParams::AssumeutxoForBlockhash
            ((CChainParams *)in_stack_fffffffffffffb08,(uint256 *)in_stack_fffffffffffffb00);
  pAVar2 = std::optional<AssumeutxoData>::operator*
                     ((optional<AssumeutxoData> *)in_stack_fffffffffffffaf8);
  memcpy(local_198,pAVar2,0x50);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,
               (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    in_stack_fffffffffffffb38 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    BaseHash<uint256>::ToString_abi_cxx11_((BaseHash<uint256> *)in_stack_fffffffffffffb00);
    in_stack_fffffffffffffb08 =
         "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"";
    in_stack_fffffffffffffb00 = "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1";
    in_stack_fffffffffffffaf8 = "out110_2.hash_serialized.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_3c8,&stack0xfffffffffffffc28,0x95,1,2,local_230);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb37 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffb37);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,
               (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               line_num,(const_string *)in_stack_fffffffffffffb20);
    in_stack_fffffffffffffb20 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
               (unsigned_long)in_stack_fffffffffffffaf8);
    local_42c[0] = 'o';
    local_42c[1] = '\0';
    local_42c[2] = '\0';
    local_42c[3] = '\0';
    in_stack_fffffffffffffb08 = "111U";
    in_stack_fffffffffffffb00 = (char *)local_42c;
    in_stack_fffffffffffffaf8 = "out110_2.m_chain_tx_count";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_418,local_42c + 4,0x96,1,2,local_170);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffb08);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_assumeutxo)
{
    const auto params = CreateChainParams(*m_node.args, ChainType::REGTEST);

    // These heights don't have assumeutxo configurations associated, per the contents
    // of kernel/chainparams.cpp.
    std::vector<int> bad_heights{0, 100, 111, 115, 209, 211};

    for (auto empty : bad_heights) {
        const auto out = params->AssumeutxoForHeight(empty);
        BOOST_CHECK(!out);
    }

    const auto out110 = *params->AssumeutxoForHeight(110);
    BOOST_CHECK_EQUAL(out110.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110.m_chain_tx_count, 111U);

    const auto out110_2 = *params->AssumeutxoForBlockhash(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"});
    BOOST_CHECK_EQUAL(out110_2.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110_2.m_chain_tx_count, 111U);
}